

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O2

REF_STATUS
ref_split_edge_ratio
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,REF_BOOL *allowed)

{
  REF_DBL *pRVar1;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  undefined8 uVar7;
  REF_INT cell;
  char *pcVar8;
  REF_DBL ratio;
  int local_c4;
  REF_GRID local_c0;
  REF_NODE local_b8;
  ulong local_b0;
  REF_INT nodes [27];
  
  local_b8 = ref_grid->node;
  *allowed = 0;
  if (ref_grid->surf == 0) {
    lVar5 = 0x28;
    if (ref_grid->twod == 0) {
      lVar5 = 0x50;
    }
  }
  else {
    lVar5 = 0x28;
  }
  ref_cell = *(REF_CELL *)((long)ref_grid->cell + lVar5 + -0x10);
  local_b0 = 0xffffffff;
  cell = -1;
  local_c0 = ref_grid;
  if (-1 < node0) {
    pRVar2 = ref_cell->ref_adj;
    local_b0 = 0xffffffff;
    cell = -1;
    if (node0 < pRVar2->nnode) {
      uVar4 = pRVar2->first[(uint)node0];
      local_b0 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar4 != -1) {
        cell = pRVar2->item[(int)uVar4].ref;
        local_b0 = (ulong)uVar4;
      }
    }
  }
  do {
    if ((int)local_b0 == -1) {
      *allowed = 1;
      return 0;
    }
    for (local_c4 = 0; local_c4 < ref_cell->node_per; local_c4 = local_c4 + 1) {
      if (ref_cell->c2n[ref_cell->size_per * cell + local_c4] == node1) {
        uVar4 = ref_cell_nodes(ref_cell,cell,nodes);
        if (uVar4 != 0) {
          pcVar8 = "cell nodes";
          uVar7 = 0x28f;
LAB_001accd5:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 uVar7,"ref_split_edge_ratio",(ulong)uVar4,pcVar8);
          return uVar4;
        }
        for (lVar5 = 0; lVar5 < ref_cell->node_per; lVar5 = lVar5 + 1) {
          if (nodes[lVar5] == node0) {
            nodes[lVar5] = new_node;
          }
        }
        for (lVar5 = 0; lVar5 < ref_cell->edge_per; lVar5 = lVar5 + 1) {
          if ((nodes[ref_cell->e2n[lVar5 * 2]] == new_node) ||
             (nodes[ref_cell->e2n[lVar5 * 2 + 1]] == new_node)) {
            uVar4 = ref_node_ratio(local_b8,nodes[ref_cell->e2n[lVar5 * 2]],
                                   nodes[ref_cell->e2n[lVar5 * 2 + 1]],&ratio);
            if (uVar4 != 0) {
              pcVar8 = "ratio node0";
              uVar7 = 0x298;
              goto LAB_001accd5;
            }
            if ((ratio < local_c0->adapt->post_min_ratio) ||
               (pRVar1 = &local_c0->adapt->post_max_ratio, *pRVar1 <= ratio && ratio != *pRVar1))
            goto LAB_001acc58;
          }
        }
        for (lVar5 = 0; uVar6 = (ulong)ref_cell->node_per, lVar5 < (long)uVar6; lVar5 = lVar5 + 1) {
          if (nodes[lVar5] == new_node) {
            nodes[lVar5] = node0;
          }
        }
        for (lVar5 = 0; lVar5 < (int)uVar6; lVar5 = lVar5 + 1) {
          if (nodes[lVar5] == node1) {
            nodes[lVar5] = new_node;
            uVar6 = (ulong)(uint)ref_cell->node_per;
          }
        }
        for (lVar5 = 0; lVar5 < ref_cell->edge_per; lVar5 = lVar5 + 1) {
          if ((nodes[ref_cell->e2n[lVar5 * 2]] == new_node) ||
             (nodes[ref_cell->e2n[lVar5 * 2 + 1]] == new_node)) {
            uVar4 = ref_node_ratio(local_b8,nodes[ref_cell->e2n[lVar5 * 2]],
                                   nodes[ref_cell->e2n[lVar5 * 2 + 1]],&ratio);
            if (uVar4 != 0) {
              pcVar8 = "ratio node0";
              uVar7 = 0x2ac;
              goto LAB_001accd5;
            }
            if ((ratio < local_c0->adapt->post_min_ratio) ||
               (pRVar1 = &local_c0->adapt->post_max_ratio, *pRVar1 <= ratio && ratio != *pRVar1)) {
LAB_001acc58:
              *allowed = 0;
              return 0;
            }
          }
        }
      }
    }
    pRVar3 = ref_cell->ref_adj->item;
    local_b0 = (ulong)pRVar3[(int)local_b0].next;
    cell = -1;
    if (local_b0 != 0xffffffffffffffff) {
      cell = pRVar3[local_b0].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_ratio(REF_GRID ref_grid, REF_INT node0,
                                        REF_INT node1, REF_INT new_node,
                                        REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_INT cell_edge, e0, e1;
  REF_DBL ratio;

  *allowed = REF_FALSE;

  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) nodes[node] = new_node;
    }

    each_ref_cell_cell_edge(ref_cell, cell_edge) { /* limit ratio */
      e0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
      e1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
      if (e0 == new_node || e1 == new_node) {
        RSS(ref_node_ratio(ref_node, e0, e1, &ratio), "ratio node0");
        if (ratio < ref_grid_adapt(ref_grid, post_min_ratio) ||
            ratio > ref_grid_adapt(ref_grid, post_max_ratio)) {
          *allowed = REF_FALSE;
          return REF_SUCCESS;
        }
      }
    }

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (new_node == nodes[node]) nodes[node] = node0;
    }
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) nodes[node] = new_node;
    }

    each_ref_cell_cell_edge(ref_cell, cell_edge) { /* limit ratio */
      e0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
      e1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
      if (e0 == new_node || e1 == new_node) {
        RSS(ref_node_ratio(ref_node, e0, e1, &ratio), "ratio node0");
        if (ratio < ref_grid_adapt(ref_grid, post_min_ratio) ||
            ratio > ref_grid_adapt(ref_grid, post_max_ratio)) {
          *allowed = REF_FALSE;
          return REF_SUCCESS;
        }
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}